

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O2

int compareteams(void *arg1,void *arg2)

{
  userinfo_t *this;
  userinfo_t *this_00;
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  char *__s1;
  char *__s2;
  
  lVar1 = *arg1;
  lVar2 = *arg2;
  this = (userinfo_t *)(lVar1 + 0x38);
  iVar3 = userinfo_t::GetTeam(this);
  this_00 = (userinfo_t *)(lVar2 + 0x38);
  iVar4 = userinfo_t::GetTeam(this_00);
  iVar3 = iVar3 - iVar4;
  if ((iVar3 == 0) && (iVar3 = *(int *)(lVar2 + 0xc4) - *(int *)(lVar1 + 0xc4), iVar3 == 0)) {
    __s1 = userinfo_t::GetName(this);
    __s2 = userinfo_t::GetName(this_00);
    iVar3 = strcasecmp(__s1,__s2);
    return iVar3;
  }
  return iVar3;
}

Assistant:

int compareteams (const void *arg1, const void *arg2)
{
	// Compare first by teams, then by frags, then by name.
	player_t *p1 = *(player_t **)arg1;
	player_t *p2 = *(player_t **)arg2;
	int diff;

	diff = p1->userinfo.GetTeam() - p2->userinfo.GetTeam();
	if (diff == 0)
	{
		diff = p2->fragcount - p1->fragcount;
		if (diff == 0)
		{
			diff = stricmp (p1->userinfo.GetName(), p2->userinfo.GetName());
		}
	}
	return diff;
}